

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

unsigned_long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,unsigned_long adj,uchar force)

{
  int iVar1;
  time_t start_time;
  ulong uVar2;
  uint window;
  uint local_2c;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return 0xffffffffffffffd9;
  }
  start_time = time((time_t *)0x0);
  do {
    iVar1 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)adj,force,&local_2c);
    if (iVar1 != -0x25) break;
    if (channel->session->api_block_mode == 0) {
      iVar1 = -0x25;
      break;
    }
    iVar1 = _libssh2_wait_socket(channel->session,start_time);
  } while (iVar1 == 0);
  uVar2 = (ulong)local_2c;
  if (iVar1 != 0) {
    uVar2 = (long)iVar1;
  }
  return uVar2;
}

Assistant:

int
_libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL * channel,
                                       uint32_t adjustment,
                                       unsigned char force,
                                       unsigned int *store)
{
    int rc;

    if(store)
        *store = channel->remote.window_size;

    if(channel->adjust_state == libssh2_NB_state_idle) {
        if(!force
            && (adjustment + channel->adjust_queue <
                LIBSSH2_CHANNEL_MINADJUST)) {
            _libssh2_debug((channel->session, LIBSSH2_TRACE_CONN,
                           "Queueing %u bytes for receive window adjustment "
                           "for channel %u/%u",
                           adjustment, channel->local.id, channel->remote.id));
            channel->adjust_queue += adjustment;
            return 0;
        }

        if(!adjustment && !channel->adjust_queue) {
            return 0;
        }

        adjustment += channel->adjust_queue;
        channel->adjust_queue = 0;

        /* Adjust the window based on the block we just freed */
        channel->adjust_adjust[0] = SSH_MSG_CHANNEL_WINDOW_ADJUST;
        _libssh2_htonu32(&channel->adjust_adjust[1], channel->remote.id);
        _libssh2_htonu32(&channel->adjust_adjust[5], adjustment);
        _libssh2_debug((channel->session, LIBSSH2_TRACE_CONN,
                       "Adjusting window %u bytes for data on "
                       "channel %u/%u",
                       adjustment, channel->local.id, channel->remote.id));

        channel->adjust_state = libssh2_NB_state_created;
    }

    rc = _libssh2_transport_send(channel->session, channel->adjust_adjust, 9,
                                 NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(channel->session, rc,
                       "Would block sending window adjust");
        return rc;
    }
    else if(rc) {
        channel->adjust_queue = adjustment;
        return _libssh2_error(channel->session, LIBSSH2_ERROR_SOCKET_SEND,
                              "Unable to send transfer-window adjustment "
                              "packet, deferring");
    }
    else {
        channel->remote.window_size += adjustment;
    }

    channel->adjust_state = libssh2_NB_state_idle;

    return 0;
}